

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

int __thiscall
pstore::brokerface::channel<std::condition_variable>::listen_abi_cxx11_
          (channel<std::condition_variable> *this,int __fd,int __n)

{
  size_type sVar1;
  condition_variable *pcVar2;
  reference pvVar3;
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  string local_60 [8];
  string message;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  subscriber_type *sub_local;
  channel<std::condition_variable> *this_local;
  
  lock._12_4_ = in_register_00000014;
  lock._8_4_ = __n;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,(mutex_type *)CONCAT44(in_register_00000034,__fd));
  do {
    if ((*(byte *)(lock._8_8_ + 0x58) & 1) == 0) {
      nothing<std::__cxx11::string>();
LAB_00129eb0:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
      return (int)this;
    }
    sVar1 = std::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)lock._8_8_);
    if (sVar1 != 0) {
      pvVar3 = std::
               queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)lock._8_8_);
      std::__cxx11::string::string(local_60,(string *)pvVar3);
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)lock._8_8_);
      just<std::__cxx11::string_const&>
                ((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)this,(pstore *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,extraout_EDX));
      std::__cxx11::string::~string(local_60);
      goto LAB_00129eb0;
    }
    pcVar2 = gsl::not_null<std::condition_variable_*>::operator->
                       ((not_null<std::condition_variable_*> *)
                        ((mutex_type *)CONCAT44(in_register_00000034,__fd) + 1));
    std::condition_variable::wait((unique_lock *)pcVar2);
  } while( true );
}

Assistant:

maybe<std::string> channel<ConditionVariable>::listen (subscriber_type & sub) {
            std::unique_lock<std::mutex> lock{mut_};
            while (sub.active_) {
                if (sub.queue_.size () == 0) {
                    cv_->wait (lock);
                } else {
                    std::string const message = std::move (sub.queue_.front ());
                    sub.queue_.pop ();
                    return just (message);
                }
            }
            return nothing<std::string> ();
        }